

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  MyClass C;
  
  pIVar1 = (ILogger *)operator_new(8);
  *(code **)pIVar1 = liblogger::ProxyLogger::LogDebug;
  liblogger::LogManager::Add(pIVar1);
  MyClass::MyClass(&C);
  MyClass::Test(&C);
  liblogger::LogManager::RemoveAll();
  std::__cxx11::string::~string((string *)&C);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

    MyClass C;
    C.Test();

	LogManager::RemoveAll();
	return 0;
}